

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

UChar32 ucnv_MBCSSimpleGetNextUChar_63
                  (UConverterSharedData *sharedData,char *source,int32_t length,UBool useFallback)

{
  uint16_t *puVar1;
  int32_t *cx_00;
  byte bVar2;
  uint uVar3;
  UChar32 UVar4;
  uint uVar5;
  int iVar6;
  int32_t *cx;
  int local_48;
  int32_t entry;
  int32_t i;
  UChar32 c;
  uint8_t action;
  uint8_t state;
  uint32_t offset;
  uint16_t *unicodeCodeUnits;
  int32_t (*stateTable) [256];
  UBool useFallback_local;
  int32_t length_local;
  char *source_local;
  UConverterSharedData *sharedData_local;
  
  if (0 < length) {
    puVar1 = (sharedData->mbcs).unicodeCodeUnits;
    c = 0;
    i._3_1_ = (sharedData->mbcs).dbcsOnlyState;
    local_48 = 0;
    do {
      iVar6 = local_48 + 1;
      uVar3 = (sharedData->mbcs).stateTable[i._3_1_][(byte)source[local_48]];
      if ((int)uVar3 < 0) {
        bVar2 = (byte)(uVar3 >> 0x14) & 0xf;
        if (bVar2 == 4) {
          uVar3 = (uVar3 & 0xffff) + c;
          entry = (int32_t)puVar1[uVar3];
          if (entry == 0xfffe) {
            entry = ucnv_MBCSGetFallback(&sharedData->mbcs,uVar3);
          }
        }
        else if ((uVar3 >> 0x14 & 0xf) == 0) {
          entry = uVar3 & 0xffff;
        }
        else if (bVar2 == 5) {
          uVar3 = (uVar3 & 0xffff) + c;
          uVar5 = uVar3 + 1;
          entry = (int32_t)puVar1[uVar3];
          if (0xd7ff < (uint)entry) {
            if ((uint)entry < 0xe000) {
              entry = (entry & 0x3ffU) * 0x400 + (uint)puVar1[uVar5] + 0x2400;
            }
            else if ((entry & 0xfffeU) == 0xe000) {
              entry = (int32_t)puVar1[uVar5];
            }
            else {
              if (entry == 0xffff) {
                return 0xffff;
              }
              entry = 0xfffe;
            }
          }
        }
        else if (bVar2 == 1) {
          entry = (uVar3 & 0xfffff) + 0x10000;
        }
        else if (bVar2 == 2) {
          entry = uVar3 & 0xffff;
        }
        else if (bVar2 == 3) {
          entry = (uVar3 & 0xfffff) + 0x10000;
        }
        else {
          if (bVar2 != 6) {
            return 0xffff;
          }
          entry = 0xfffe;
        }
        if (iVar6 == length) {
          if ((entry == 0xfffe) && (cx_00 = (sharedData->mbcs).extIndexes, cx_00 != (int32_t *)0x0))
          {
            UVar4 = ucnv_extSimpleMatchToU_63(cx_00,source,length,useFallback);
            return UVar4;
          }
          return entry;
        }
        return 0xffff;
      }
      i._3_1_ = (byte)(uVar3 >> 0x18);
      c = (uVar3 & 0xffffff) + c;
      local_48 = iVar6;
    } while (iVar6 != length);
  }
  return 0xffff;
}

Assistant:

U_CFUNC UChar32
ucnv_MBCSSimpleGetNextUChar(UConverterSharedData *sharedData,
                        const char *source, int32_t length,
                        UBool useFallback) {
    const int32_t (*stateTable)[256];
    const uint16_t *unicodeCodeUnits;

    uint32_t offset;
    uint8_t state, action;

    UChar32 c;
    int32_t i, entry;

    if(length<=0) {
        /* no input at all: "illegal" */
        return 0xffff;
    }

#if 0
/*
 * Code disabled 2002dec09 (ICU 2.4) because it is not currently used in ICU. markus
 * TODO In future releases, verify that this function is never called for SBCS
 * conversions, i.e., that sharedData->mbcs.countStates==1 is still true.
 * Removal improves code coverage.
 */
    /* use optimized function if possible */
    if(sharedData->mbcs.countStates==1) {
        if(length==1) {
            return ucnv_MBCSSingleSimpleGetNextUChar(sharedData, (uint8_t)*source, useFallback);
        } else {
            return 0xffff; /* illegal: more than a single byte for an SBCS converter */
        }
    }
#endif

    /* set up the local pointers */
    stateTable=sharedData->mbcs.stateTable;
    unicodeCodeUnits=sharedData->mbcs.unicodeCodeUnits;

    /* converter state */
    offset=0;
    state=sharedData->mbcs.dbcsOnlyState;

    /* conversion loop */
    for(i=0;;) {
        entry=stateTable[state][(uint8_t)source[i++]];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);

            if(i==length) {
                return 0xffff; /* truncated character */
            }
        } else {
            /*
             * An if-else-if chain provides more reliable performance for
             * the most common cases compared to a switch.
             */
            action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
            if(action==MBCS_STATE_VALID_16) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset];
                if(c!=0xfffe) {
                    /* done */
                } else if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                    c=ucnv_MBCSGetFallback(&sharedData->mbcs, offset);
                /* else done with 0xfffe */
                }
                break;
            } else if(action==MBCS_STATE_VALID_DIRECT_16) {
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                break;
            } else if(action==MBCS_STATE_VALID_16_PAIR) {
                offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[offset++];
                if(c<0xd800) {
                    /* output BMP code point below 0xd800 */
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? c<=0xdfff : c<=0xdbff) {
                    /* output roundtrip or fallback supplementary code point */
                    c=(UChar32)(((c&0x3ff)<<10)+unicodeCodeUnits[offset]+(0x10000-0xdc00));
                } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? (c&0xfffe)==0xe000 : c==0xe000) {
                    /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                    c=unicodeCodeUnits[offset];
                } else if(c==0xffff) {
                    return 0xffff;
                } else {
                    c=0xfffe;
                }
                break;
            } else if(action==MBCS_STATE_VALID_DIRECT_20) {
                /* output supplementary code point */
                c=0x10000+MBCS_ENTRY_FINAL_VALUE(entry);
                break;
            } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
                if(!TO_U_USE_FALLBACK(useFallback)) {
                    c=0xfffe;
                    break;
                }
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                break;
            } else if(action==MBCS_STATE_FALLBACK_DIRECT_20) {
                if(!TO_U_USE_FALLBACK(useFallback)) {
                    c=0xfffe;
                    break;
                }
                /* output supplementary code point */
                c=0x10000+MBCS_ENTRY_FINAL_VALUE(entry);
                break;
            } else if(action==MBCS_STATE_UNASSIGNED) {
                c=0xfffe;
                break;
            }

            /*
             * forbid MBCS_STATE_CHANGE_ONLY for this function,
             * and MBCS_STATE_ILLEGAL and reserved action codes
             */
            return 0xffff;
        }
    }

    if(i!=length) {
        /* illegal for this function: not all input consumed */
        return 0xffff;
    }

    if(c==0xfffe) {
        /* try an extension mapping */
        const int32_t *cx=sharedData->mbcs.extIndexes;
        if(cx!=NULL) {
            return ucnv_extSimpleMatchToU(cx, source, length, useFallback);
        }
    }

    return c;
}